

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram.c
# Opt level: O1

CURLcode Curl_auth_decode_cram_md5_message(char *chlg64,char **outptr,size_t *outlen)

{
  char cVar1;
  uchar uVar2;
  CURLcode CVar3;
  size_t sVar4;
  uchar *puVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  char cVar11;
  ulong uVar12;
  ulong uVar13;
  size_t sVar14;
  uchar *puVar15;
  
  cVar1 = *chlg64;
  *outptr = (char *)0x0;
  *outlen = 0;
  if ((cVar1 == '\0') || (*chlg64 == '=')) {
    return CURLE_OK;
  }
  *outptr = (char *)0x0;
  *outlen = 0;
  sVar4 = strlen(chlg64);
  CVar3 = CURLE_BAD_CONTENT_ENCODING;
  if ((sVar4 & 3) == 0 && sVar4 != 0) {
    for (lVar9 = 0; chlg64[lVar9] != '\0'; lVar9 = lVar9 + 1) {
      if (chlg64[lVar9] == '=') {
        lVar6 = (ulong)(chlg64[lVar9 + 1] == '=') + 1;
        goto LAB_0010cdd8;
      }
    }
    lVar6 = 0;
LAB_0010cdd8:
    if (sVar4 - lVar6 == lVar9) {
      uVar13 = sVar4 >> 2;
      sVar14 = uVar13 * 3 - lVar6;
      puVar5 = (uchar *)(*Curl_cmalloc)(sVar14 + 1);
      if (puVar5 == (uchar *)0x0) {
        CVar3 = CURLE_OUT_OF_MEMORY;
      }
      else {
        lVar9 = 0;
        puVar15 = puVar5;
        do {
          uVar12 = 0;
          lVar6 = 0;
          uVar8 = 0;
          pcVar7 = chlg64;
          do {
            cVar1 = *pcVar7;
            if (cVar1 == '=') {
              uVar12 = uVar12 << 6;
              uVar8 = uVar8 + 1;
            }
            else {
              lVar10 = 0;
              if (cVar1 == 'A') {
                cVar11 = 'A';
              }
              else {
                do {
                  cVar11 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                           [lVar10 + 1];
                  lVar10 = lVar10 + 1;
                  if (cVar11 == '\0') break;
                } while (cVar11 != cVar1);
              }
              uVar12 = uVar12 * 0x40 + lVar10;
              if (cVar11 != cVar1) {
                lVar6 = 0;
                goto LAB_0010cec9;
              }
            }
            lVar6 = lVar6 + 1;
            pcVar7 = pcVar7 + 1;
          } while (lVar6 != 4);
          if (uVar8 == 0) {
            uVar2 = curlx_ultouc(uVar12 & 0xff);
            puVar15[2] = uVar2;
          }
          if (uVar8 < 2) {
            uVar2 = curlx_ultouc(uVar12 >> 8 & 0xff);
            puVar15[1] = uVar2;
          }
          uVar2 = curlx_ultouc(uVar12 >> 0x10 & 0xff);
          *puVar15 = uVar2;
          lVar6 = 3 - uVar8;
LAB_0010cec9:
          if (lVar6 == 0) {
            (*Curl_cfree)(puVar5);
            return CURLE_BAD_CONTENT_ENCODING;
          }
          puVar15 = puVar15 + lVar6;
          chlg64 = chlg64 + 4;
          lVar9 = lVar9 + 1;
        } while (lVar9 != uVar13 + (uVar13 == 0));
        *puVar15 = '\0';
        *outptr = (char *)puVar5;
        *outlen = sVar14;
        CVar3 = CURLE_OK;
      }
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_auth_decode_cram_md5_message(const char *chlg64, char **outptr,
                                           size_t *outlen)
{
  CURLcode result = CURLE_OK;
  size_t chlg64len = strlen(chlg64);

  *outptr = NULL;
  *outlen = 0;

  /* Decode the challenge if necessary */
  if(chlg64len && *chlg64 != '=')
    result = Curl_base64_decode(chlg64, (unsigned char **) outptr, outlen);

  return result;
}